

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNotFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_BOOLEAN)) {
          xmlXPathBooleanFunction(ctxt,1);
        }
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_BOOLEAN)) {
          xmlXPathErr(ctxt,0xb);
        }
        else {
          ctxt->value->boolval = (uint)((ctxt->value->boolval != 0 ^ 0xffU) & 1);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathNotFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(1);
    CAST_TO_BOOLEAN;
    CHECK_TYPE(XPATH_BOOLEAN);
    ctxt->value->boolval = ! ctxt->value->boolval;
}